

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall
CVmObjDict::restore_from_file(CVmObjDict *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  undefined2 uVar1;
  vm_obj_id_t obj_00;
  uint uVar2;
  uint uVar3;
  vm_obj_id_t vVar4;
  vm_dict_ext *pvVar5;
  CVmObjFixup *in_RCX;
  CVmHashTable *in_RDX;
  CVmObjTable *in_RDI;
  vm_prop_id_t prop;
  vm_obj_id_t obj;
  uint item_cnt;
  char buf [256];
  uint read_len;
  uint len;
  vm_obj_id_t comp;
  ulong cnt;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  CVmFile *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  CVmHashTable *in_stack_fffffffffffffe90;
  vmdict_TrieNode *in_stack_fffffffffffffea0;
  CVmHashTable *in_stack_fffffffffffffea8;
  undefined6 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffed0;
  CVmObjDict *in_stack_fffffffffffffef0;
  uint local_34;
  ulong local_28;
  
  pvVar5 = get_ext((CVmObjDict *)in_RDI);
  if (pvVar5->hashtab_ != (CVmHashTable *)0x0) {
    pvVar5 = get_ext((CVmObjDict *)in_RDI);
    in_stack_fffffffffffffea8 = pvVar5->hashtab_;
    if (in_stack_fffffffffffffea8 != (CVmHashTable *)0x0) {
      CVmHashTable::~CVmHashTable(in_stack_fffffffffffffe90);
      operator_delete(in_stack_fffffffffffffea8,0x20);
    }
    pvVar5 = get_ext((CVmObjDict *)in_RDI);
    pvVar5->hashtab_ = (CVmHashTable *)0x0;
  }
  pvVar5 = get_ext((CVmObjDict *)in_RDI);
  if (pvVar5->trie_ != (vmdict_TrieNode *)0x0) {
    pvVar5 = get_ext((CVmObjDict *)in_RDI);
    in_stack_fffffffffffffea0 = pvVar5->trie_;
    if (in_stack_fffffffffffffea0 != (vmdict_TrieNode *)0x0) {
      vmdict_TrieNode::~vmdict_TrieNode((vmdict_TrieNode *)in_stack_fffffffffffffe90);
      operator_delete(in_stack_fffffffffffffea0,0x18);
    }
    pvVar5 = get_ext((CVmObjDict *)in_RDI);
    pvVar5->trie_ = (vmdict_TrieNode *)0x0;
  }
  CVmFile::read_uint4(in_stack_fffffffffffffe80);
  obj_00 = CVmObjFixup::get_new_id(in_RCX,(vm_obj_id_t)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  create_hash_table(in_stack_fffffffffffffef0);
  for (local_28 = CVmFile::read_uint4(in_stack_fffffffffffffe80); local_28 != 0;
      local_28 = local_28 - 1) {
    uVar2 = CVmFile::read_uint2(in_stack_fffffffffffffe80);
    local_34 = uVar2;
    if (0x100 < uVar2) {
      local_34 = 0x100;
    }
    CVmFile::read_bytes((CVmFile *)in_stack_fffffffffffffe90,
                        (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                        (size_t)in_stack_fffffffffffffe80);
    if (local_34 < uVar2) {
      in_stack_fffffffffffffe90 = in_RDX;
      CVmFile::get_pos(in_stack_fffffffffffffe80);
      CVmFile::set_pos(in_stack_fffffffffffffe80,
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    for (uVar2 = CVmFile::read_uint2(in_stack_fffffffffffffe80); uVar2 != 0; uVar2 = uVar2 - 1) {
      CVmFile::read_uint4(in_stack_fffffffffffffe80);
      uVar3 = CVmFile::read_uint2(in_stack_fffffffffffffe80);
      uVar1 = (undefined2)uVar3;
      vVar4 = CVmObjFixup::get_new_id
                        (in_RCX,(vm_obj_id_t)((ulong)in_stack_fffffffffffffe90 >> 0x20));
      if (vVar4 != 0) {
        in_stack_fffffffffffffe78 = 0;
        add_hash_entry((CVmObjDict *)CONCAT44(uVar2,vVar4),
                       (char *)CONCAT26(uVar1,in_stack_fffffffffffffeb8),(size_t)in_RDI,
                       (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                       (vm_obj_id_t)in_stack_fffffffffffffea8,
                       (vm_prop_id_t)((ulong)in_stack_fffffffffffffea0 >> 0x30),
                       in_stack_fffffffffffffed0);
      }
    }
  }
  pvVar5 = get_ext((CVmObjDict *)in_RDI);
  vVar4 = (vm_obj_id_t)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  pvVar5->comparator_ = obj_00;
  set_comparator_type((CVmObjDict *)in_stack_fffffffffffffe90,obj_00);
  pvVar5 = get_ext((CVmObjDict *)in_RDI);
  pvVar5->modified_ = 1;
  CVmObjTable::request_post_load_init(in_RDI,vVar4);
  return;
}

Assistant:

void CVmObjDict::restore_from_file(VMG_ vm_obj_id_t self,
                                   CVmFile *fp, CVmObjFixup *fixups)
{
    ulong cnt;
    vm_obj_id_t comp;

    /* delete the old hash table if we have one */
    if (get_ext()->hashtab_ != 0)
    {
        delete get_ext()->hashtab_;
        get_ext()->hashtab_ = 0;
    }

    /* delete the Trie if we have one */
    if (get_ext()->trie_ != 0)
    {
        delete get_ext()->trie_;
        get_ext()->trie_ = 0;
    }

    /* 
     *   Read the comparator and fix it up to the new object numbering
     *   scheme, but do not install it (as it might not be loaded yet).  
     */
    comp = fixups->get_new_id(vmg_ (vm_obj_id_t)fp->read_uint4());

    /* create the new, empty hash table */
    create_hash_table(vmg0_);

    /* read the number of symbols */
    cnt = fp->read_uint4();

    /* read the symbols */
    for ( ; cnt != 0 ; --cnt)
    {
        uint len;
        uint read_len;
        char buf[256];
        uint item_cnt;
        
        /* read the symbol length */
        len = fp->read_uint2();

        /* limit the reading to our buffer size */
        read_len = len;
        if (read_len > sizeof(buf))
            read_len = sizeof(buf);

        /* read the string */
        fp->read_bytes(buf, read_len);

        /* skip any extra data */
        if (len > read_len)
            fp->set_pos(fp->get_pos() + len - read_len);

        /* read the item count */
        item_cnt = fp->read_uint2();

        /* read the items */
        for ( ; item_cnt != 0 ; --item_cnt)
        {
            vm_obj_id_t obj;
            vm_prop_id_t prop;
            
            /* read the object and property ID's */
            obj = (vm_obj_id_t)fp->read_uint4();
            prop = (vm_prop_id_t)fp->read_uint2();

            /* translate the object ID through the fixup table */
            obj = fixups->get_new_id(vmg_ obj);

            /* add the entry, if it refers to a valid object */
            if (obj != VM_INVALID_OBJ)
                add_hash_entry(vmg_ buf, len, TRUE, obj, prop, FALSE);
        }
    }

    /* 
     *   install the comparator (we can't set its type yet, though, because
     *   the object might not be loaded yet) 
     */
    get_ext()->comparator_ = comp;
    set_comparator_type(vmg_ VM_INVALID_OBJ);

    /*
     *   If we had to restore it, we'll have to save it if the current state
     *   is later saved, even if we don't modify it again.  The fact that
     *   this version was saved before means this version has to be saved
     *   from now on.  
     */
    get_ext()->modified_ = TRUE;

    /* 
     *   register for post-load initialization, so that we can rebuild the
     *   hash table with the actual comparator if necessary 
     */
    G_obj_table->request_post_load_init(self);
}